

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall
chrono::ChFile_ps::ClipRectangle
          (ChFile_ps *this,ChVector2<double> *mfrom,ChVector2<double> *mwh,Space space)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [32];
  double local_48 [2];
  undefined1 local_38 [32];
  
  dVar1 = mfrom->m_data[0];
  dVar2 = mwh->m_data[0];
  dVar4 = dVar1 + dVar2;
  dVar5 = mfrom->m_data[1] + mwh->m_data[1];
  StartLine(this);
  local_78 = mfrom->m_data[0];
  dStack_70 = mfrom->m_data[1];
  TransPt((ChFile_ps *)(local_38 + 0x10),(ChVector2<double> *)this,(Space)&local_78);
  MoveTo(this,(ChVector2<double> *)(local_38 + 0x10));
  local_48[0] = dVar1 + dVar2;
  local_48[1] = 0.0;
  TransPt((ChFile_ps *)local_38,(ChVector2<double> *)this,(Space)local_48);
  AddLinePoint(this,(ChVector2<double> *)local_38);
  local_88 = dVar4;
  dStack_80 = dVar5;
  TransPt((ChFile_ps *)(local_68 + 0x10),(ChVector2<double> *)this,(Space)&local_88);
  AddLinePoint(this,(ChVector2<double> *)(local_68 + 0x10));
  auVar3._8_8_ = dVar5;
  auVar3._0_8_ = dVar4;
  local_98 = vmovlps_avx(auVar3,dVar1);
  TransPt((ChFile_ps *)local_68,(ChVector2<double> *)this,(Space)local_98);
  AddLinePoint(this,(ChVector2<double> *)local_68);
  CloseLine(this);
  Clip(this);
  return;
}

Assistant:

void ChFile_ps::ClipRectangle(ChVector2<> mfrom, ChVector2<> mwh, Space space) {
    ChVector2<> mp1, mp2, mp3;
    mp1.x() = mfrom.x() + mwh.x();
    mp1.y() = mfrom.y();
    mp2.x() = mfrom.x() + mwh.x();
    mp2.y() = mfrom.y() + mwh.y();
    mp3.x() = mfrom.x();
    mp3.y() = mfrom.y() + mwh.y();
    StartLine();
    MoveTo(TransPt(mfrom, space));
    AddLinePoint(TransPt(mp1, space));
    AddLinePoint(TransPt(mp2, space));
    AddLinePoint(TransPt(mp3, space));
    CloseLine();
    Clip();
}